

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O2

void wave_morale_flag(tgestate_t *state)

{
  byte bVar1;
  byte bVar2;
  uint8_t *puVar3;
  long lVar4;
  long lVar5;
  uint8_t *src;
  
  bVar2 = state->game_counter;
  bVar1 = bVar2 + 1;
  state->game_counter = bVar1;
  if ((bVar2 & 1) == 0) {
    return;
  }
  bVar2 = state->displayed_morale;
  if (state->morale == bVar2) {
    puVar3 = state->moraleflag_screen_address;
  }
  else {
    if (state->morale < bVar2) {
      state->displayed_morale = bVar2 - 1;
      puVar3 = get_next_scanline(state,state->moraleflag_screen_address);
    }
    else {
      state->displayed_morale = bVar2 + 1;
      puVar3 = state->moraleflag_screen_address + (-0x30 - (long)state->speccy);
      lVar5 = 0x6e0;
      if (((ulong)puVar3 & 0xe0) == 0) {
        lVar5 = -0x20;
      }
      lVar4 = -0x100;
      if (((ulong)puVar3 & 0x700) == 0) {
        lVar4 = lVar5;
      }
      puVar3 = state->moraleflag_screen_address + lVar4;
    }
    state->moraleflag_screen_address = puVar3;
  }
  if ((bVar1 & 2) == 0) {
    src = "";
  }
  else {
    src = "";
  }
  plot_bitmap(state,src,puVar3,'\x03','\x19');
  return;
}

Assistant:

void wave_morale_flag(tgestate_t *state)
{
  uint8_t       *pgame_counter;     /* was HL */
  uint8_t        morale;            /* was A */
  uint8_t       *pdisplayed_morale; /* was HL */
  uint8_t       *scanline;          /* was HL */
  const uint8_t *flag_bitmap;       /* was DE */

  assert(state != NULL);

  pgame_counter = &state->game_counter;
  (*pgame_counter)++;

  /* Wave the flag on every other turn. */
  if (*pgame_counter & 1)
    return;

  morale = state->morale;
  pdisplayed_morale = &state->displayed_morale;
  if (morale != *pdisplayed_morale)
  {
    if (morale < *pdisplayed_morale)
    {
      /* Decreasing morale. */
      (*pdisplayed_morale)--;
      scanline = get_next_scanline(state, state->moraleflag_screen_address);
    }
    else
    {
      /* Increasing morale. */
      (*pdisplayed_morale)++;
      scanline = get_prev_scanline(state, state->moraleflag_screen_address);
    }
    state->moraleflag_screen_address = scanline;
  }

  flag_bitmap = &flag_down[0];
  if (*pgame_counter & 2)
    flag_bitmap = &flag_up[0];
  plot_bitmap(state,
              flag_bitmap,
              state->moraleflag_screen_address,
              3, 25);
}